

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_sound_srcs.cxx
# Opt level: O0

void __thiscall xray_re::xr_sound_src_object::load(xr_sound_src_object *this,xr_reader *r)

{
  size_t sVar1;
  float fVar2;
  unsigned_short local_1a;
  xr_reader *pxStack_18;
  uint16_t version;
  xr_reader *r_local;
  xr_sound_src_object *this_local;
  
  pxStack_18 = r;
  r_local = (xr_reader *)this;
  sVar1 = xr_reader::r_chunk<unsigned_short>(r,0x1001,&local_1a);
  if (sVar1 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_sound_srcs.cxx"
                  ,0x1a,"virtual void xray_re::xr_sound_src_object::load(xr_reader &)");
  }
  if (local_1a != 0x14) {
    __assert_fail("version == SOUNDSRC_VERSION",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_sound_srcs.cxx"
                  ,0x1b,"virtual void xray_re::xr_sound_src_object::load(xr_reader &)");
  }
  xr_custom_object::load(&this->super_xr_custom_object,pxStack_18);
  sVar1 = xr_reader::r_chunk<unsigned_char>(pxStack_18,0x1002,&this->m_type);
  if (sVar1 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_sound_srcs.cxx"
                  ,0x1e,"virtual void xray_re::xr_sound_src_object::load(xr_reader &)");
  }
  sVar1 = xr_reader::find_chunk(pxStack_18,0x1003);
  if (sVar1 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_sound_srcs.cxx"
                  ,0x20,"virtual void xray_re::xr_sound_src_object::load(xr_reader &)");
  }
  xr_reader::r_sz(pxStack_18,&this->m_source_name);
  xr_reader::debug_find_chunk(pxStack_18);
  sVar1 = xr_reader::find_chunk(pxStack_18,0x1007);
  if (sVar1 == 0) {
    sVar1 = xr_reader::find_chunk(pxStack_18,0x1006);
    if (sVar1 == 0) {
      sVar1 = xr_reader::find_chunk(pxStack_18,0x1004);
      if (sVar1 == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_sound_srcs.cxx"
                      ,0x35,"virtual void xray_re::xr_sound_src_object::load(xr_reader &)");
      }
      xr_reader::r_fvector3(pxStack_18,&this->m_sound_pos);
      fVar2 = xr_reader::r_float(pxStack_18);
      this->m_volume = fVar2;
      fVar2 = xr_reader::r_float(pxStack_18);
      this->m_frequency = fVar2;
      fVar2 = xr_reader::r_float(pxStack_18);
      this->m_min_dist = fVar2;
      fVar2 = xr_reader::r_float(pxStack_18);
      this->m_max_dist = fVar2;
      this->m_max_ai_dist = this->m_max_dist;
      xr_reader::debug_find_chunk(pxStack_18);
      goto LAB_00222831;
    }
  }
  xr_reader::r_fvector3(pxStack_18,&this->m_sound_pos);
  fVar2 = xr_reader::r_float(pxStack_18);
  this->m_volume = fVar2;
  fVar2 = xr_reader::r_float(pxStack_18);
  this->m_frequency = fVar2;
  fVar2 = xr_reader::r_float(pxStack_18);
  this->m_min_dist = fVar2;
  fVar2 = xr_reader::r_float(pxStack_18);
  this->m_max_dist = fVar2;
  fVar2 = xr_reader::r_float(pxStack_18);
  this->m_max_ai_dist = fVar2;
  xr_reader::debug_find_chunk(pxStack_18);
LAB_00222831:
  xr_reader::r_chunk<unsigned_int>
            (pxStack_18,0x1005,(uint *)&(this->super_xr_custom_object).field_0x6c);
  sVar1 = xr_reader::find_chunk(pxStack_18,0x1008);
  if (sVar1 != 0) {
    xr_reader::r_fvector2(pxStack_18,&this->m_pause_time);
    xr_reader::r_fvector2(pxStack_18,&this->m_active_time);
    xr_reader::r_fvector2(pxStack_18,&this->m_play_time);
    xr_reader::debug_find_chunk(pxStack_18);
  }
  return;
}

Assistant:

void xr_sound_src_object::load(xr_reader& r)
{
	uint16_t version;
	if (!r.r_chunk<uint16_t>(SOUNDSRC_CHUNK_VERSION, version))
		xr_not_expected();
	xr_assert(version == SOUNDSRC_VERSION);
	xr_custom_object::load(r);
	if (!r.r_chunk<uint8_t>(SOUNDSRC_CHUNK_TYPE, m_type))
		xr_not_expected();
	if (!r.find_chunk(SOUNDSRC_CHUNK_SOURCE_NAME))
		xr_not_expected();
	r.r_sz(m_source_name);
	r.debug_find_chunk();
	if (r.find_chunk(SOUNDSRC_CHUNK_PARAMS_2) ||
			r.find_chunk(SOUNDSRC_CHUNK_PARAMS_1)) {
		r.r_fvector3(m_sound_pos);
		m_volume = r.r_float();
		m_frequency = r.r_float();
		m_min_dist = r.r_float();
		m_max_dist = r.r_float();
		m_max_ai_dist = r.r_float();
		r.debug_find_chunk();
	} else if (r.find_chunk(SOUNDSRC_CHUNK_PARAMS_0)) {
		r.r_fvector3(m_sound_pos);
		m_volume = r.r_float();
		m_frequency = r.r_float();
		m_min_dist = r.r_float();
		m_max_dist = r.r_float();
		m_max_ai_dist = m_max_dist;
		r.debug_find_chunk();
	} else {
		xr_not_expected();
	}
	r.r_chunk<uint32_t>(SOUNDSRC_CHUNK_FLAGS, m_flags);
	if (r.find_chunk(SOUNDSRC_CHUNK_TIME)) {
		r.r_fvector2(m_pause_time);
		r.r_fvector2(m_active_time);
		r.r_fvector2(m_play_time);
		r.debug_find_chunk();
	}
}